

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_slice.c
# Opt level: O0

MPP_RET dec_ref_pic_marking(H264_SLICE_t *pSlice)

{
  h264d_cur_ctx_t *phVar1;
  MPP_RET MVar2;
  h264_drpm_t *phVar3;
  RK_U32 local_6c;
  RK_U32 local_68;
  RK_U32 _out_7;
  RK_U32 _out_6;
  RK_U32 _out_5;
  RK_U32 _out_4;
  RK_U32 _out_3;
  RK_U32 i;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 _out;
  BitReadCtx_t *p_bitctx;
  H264dVideoCtx_t *p_Vid;
  H264_DRPM_t *tmp_drpm2;
  H264_DRPM_t *tmp_drpm;
  RK_U32 emulation_prevention;
  RK_U32 drpm_used_bits;
  MPP_RET ret;
  RK_U32 val;
  H264_SLICE_t *pSlice_local;
  
  drpm_used_bits = 0;
  emulation_prevention = 0xfffffffe;
  tmp_drpm2 = (H264_DRPM_t *)0x0;
  p_Vid = (H264dVideoCtx_t *)0x0;
  p_bitctx = (BitReadCtx_t *)pSlice->p_Vid;
  phVar1 = pSlice->p_Cur;
  __out_1 = &phVar1->bitctx;
  tmp_drpm._4_4_ = (phVar1->bitctx).used_bits;
  tmp_drpm._0_4_ = (int)(phVar1->bitctx).emulation_prevention_bytes_;
  pSlice->drpm_used_bitlen = 0;
  _ret = pSlice;
  if ((pSlice->idr_flag == 0) &&
     ((pSlice->svc_extension_flag != 0 || ((pSlice->mvcExt).non_idr_flag != 0)))) {
    MVar2 = mpp_read_bits(__out_1,1,(RK_S32 *)&_out_3);
    __out_1->ret = MVar2;
    if (__out_1->ret == MPP_OK) {
      _ret->adaptive_ref_pic_buffering_flag = _out_3;
      if (_ret->adaptive_ref_pic_buffering_flag != 0) {
        for (_out_4 = 0; _out_4 < 0x23; _out_4 = _out_4 + 1) {
          if (_ret->p_Cur->dec_ref_pic_marking_buffer[_out_4] == (h264_drpm_t *)0x0) {
            phVar3 = (h264_drpm_t *)mpp_osal_calloc("dec_ref_pic_marking",0x20);
            _ret->p_Cur->dec_ref_pic_marking_buffer[_out_4] = phVar3;
          }
          tmp_drpm2 = _ret->p_Cur->dec_ref_pic_marking_buffer[_out_4];
          tmp_drpm2->Next = (h264_drpm_t *)0x0;
          MVar2 = mpp_read_ue(__out_1,&_out_5);
          __out_1->ret = MVar2;
          if (__out_1->ret != MPP_OK) goto LAB_001be89a;
          drpm_used_bits = _out_5;
          tmp_drpm2->memory_management_control_operation = _out_5;
          if (_out_5 == 0) break;
          if ((_out_5 == 1) || (_out_5 == 3)) {
            MVar2 = mpp_read_ue(__out_1,&_out_6);
            __out_1->ret = MVar2;
            if (__out_1->ret != MPP_OK) goto LAB_001be89a;
            tmp_drpm2->difference_of_pic_nums_minus1 = _out_6;
          }
          if (drpm_used_bits == 2) {
            MVar2 = mpp_read_ue(__out_1,&_out_7);
            __out_1->ret = MVar2;
            if (__out_1->ret != MPP_OK) goto LAB_001be89a;
            tmp_drpm2->long_term_pic_num = _out_7;
          }
          if ((drpm_used_bits == 3) || (drpm_used_bits == 6)) {
            MVar2 = mpp_read_ue(__out_1,&local_68);
            __out_1->ret = MVar2;
            if (__out_1->ret != MPP_OK) goto LAB_001be89a;
            tmp_drpm2->long_term_frame_idx = local_68;
          }
          if (drpm_used_bits == 4) {
            MVar2 = mpp_read_ue(__out_1,&local_6c);
            __out_1->ret = MVar2;
            if (__out_1->ret != MPP_OK) goto LAB_001be89a;
            tmp_drpm2->max_long_term_frame_idx_plus1 = local_6c;
          }
          if (_ret->dec_ref_pic_marking_buffer == (h264_drpm_t *)0x0) {
            _ret->dec_ref_pic_marking_buffer = tmp_drpm2;
          }
          else {
            for (p_Vid = (H264dVideoCtx_t *)_ret->dec_ref_pic_marking_buffer;
                p_Vid->spsSet[3] != (h264_sps_t *)0x0; p_Vid = (H264dVideoCtx_t *)p_Vid->spsSet[3])
            {
            }
            p_Vid->spsSet[3] = (h264_sps_t *)tmp_drpm2;
          }
        }
        if (0x22 < _out_4) {
          if ((h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_slice","Too many memory management control operations.",(char *)0x0)
            ;
          }
          goto LAB_001be89a;
        }
      }
LAB_001be85d:
      _ret->drpm_used_bitlen =
           (__out_1->used_bits - tmp_drpm._4_4_) +
           ((int)__out_1->emulation_prevention_bytes_ - (int)tmp_drpm) * -8;
      return MPP_OK;
    }
  }
  else {
    MVar2 = mpp_read_bits(__out_1,1,&_out_2);
    __out_1->ret = MVar2;
    if (__out_1->ret == MPP_OK) {
      _ret->no_output_of_prior_pics_flag = _out_2;
      *(RK_S32 *)((long)&p_bitctx[0x23].buf + 4) = _ret->no_output_of_prior_pics_flag;
      MVar2 = mpp_read_bits(__out_1,1,(RK_S32 *)&i);
      __out_1->ret = MVar2;
      if (__out_1->ret == MPP_OK) {
        _ret->long_term_reference_flag = i;
        goto LAB_001be85d;
      }
    }
  }
LAB_001be89a:
  return __out_1->ret;
}

Assistant:

static MPP_RET dec_ref_pic_marking(H264_SLICE_t *pSlice)
{
    RK_U32 val = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_U32 drpm_used_bits = 0;
    RK_U32 emulation_prevention = 0;
    H264_DRPM_t *tmp_drpm = NULL, *tmp_drpm2 = NULL;
    H264dVideoCtx_t *p_Vid = pSlice->p_Vid;
    BitReadCtx_t *p_bitctx = &pSlice->p_Cur->bitctx;

    drpm_used_bits = p_bitctx->used_bits;
    emulation_prevention = p_bitctx->emulation_prevention_bytes_;
    pSlice->drpm_used_bitlen = 0;

    if (pSlice->idr_flag ||
        (pSlice->svc_extension_flag == 0 && pSlice->mvcExt.non_idr_flag == 0)) {
        READ_ONEBIT(p_bitctx, &pSlice->no_output_of_prior_pics_flag);
        p_Vid->no_output_of_prior_pics_flag = pSlice->no_output_of_prior_pics_flag;
        READ_ONEBIT(p_bitctx, &pSlice->long_term_reference_flag);
    } else {
        READ_ONEBIT(p_bitctx, &pSlice->adaptive_ref_pic_buffering_flag);

        if (pSlice->adaptive_ref_pic_buffering_flag) {
            RK_U32 i = 0;

            for (i = 0; i < MAX_MARKING_TIMES; i++) {
                if (!pSlice->p_Cur->dec_ref_pic_marking_buffer[i])
                    pSlice->p_Cur->dec_ref_pic_marking_buffer[i] = mpp_calloc(H264_DRPM_t, 1);
                tmp_drpm = pSlice->p_Cur->dec_ref_pic_marking_buffer[i];
                tmp_drpm->Next = NULL;
                READ_UE(p_bitctx, &val); //!< mmco
                tmp_drpm->memory_management_control_operation = val;
                if (val == 0)
                    break;

                if ((val == 1) || (val == 3)) {
                    READ_UE(p_bitctx, &tmp_drpm->difference_of_pic_nums_minus1);
                }
                if (val == 2) {
                    READ_UE(p_bitctx, &tmp_drpm->long_term_pic_num);
                }
                if ((val == 3) || (val == 6)) {
                    READ_UE(p_bitctx, &tmp_drpm->long_term_frame_idx);
                }
                if (val == 4) {
                    READ_UE(p_bitctx, &tmp_drpm->max_long_term_frame_idx_plus1);
                }
                // add command
                if (pSlice->dec_ref_pic_marking_buffer == NULL) {
                    pSlice->dec_ref_pic_marking_buffer = tmp_drpm;
                } else {
                    tmp_drpm2 = pSlice->dec_ref_pic_marking_buffer;
                    while (tmp_drpm2->Next != NULL) {
                        tmp_drpm2 = tmp_drpm2->Next;
                    }
                    tmp_drpm2->Next = tmp_drpm;
                }
            }
            if (i >= MAX_MARKING_TIMES) {
                H264D_ERR("Too many memory management control operations.");
                goto __BITREAD_ERR;
            }
        }
    }

    // need to minus emulation prevention bytes(0x000003) we met
    emulation_prevention = p_bitctx->emulation_prevention_bytes_ - emulation_prevention;
    pSlice->drpm_used_bitlen = p_bitctx->used_bits - drpm_used_bits - (emulation_prevention * 8);

    return ret = MPP_OK;
__BITREAD_ERR:
    ret = p_bitctx->ret;

    return ret;
}